

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O2

void * env_tilde_new(t_floatarg fnpoints,t_floatarg fperiod)

{
  int iVar1;
  _binbuf *p_Var2;
  t_object *owner;
  long lVar3;
  _clock *p_Var4;
  t_symbol *s;
  t_pd p_Var5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  
  uVar7 = 0x400;
  if (0 < (int)fnpoints) {
    uVar7 = (int)fnpoints;
  }
  p_Var2 = (_binbuf *)getbytes((long)(int)uVar7 * 4 + 0x100);
  if (p_Var2 == (_binbuf *)0x0) {
    owner = (t_object *)0x0;
    pd_error((void *)0x0,"env: couldn\'t allocate buffer");
  }
  else {
    iVar6 = (int)uVar7 / 2;
    if (0 < (int)fperiod) {
      iVar6 = (int)fperiod;
    }
    iVar1 = (int)uVar7 / 0x20 + 1;
    if ((int)uVar7 / 0x20 < iVar6) {
      iVar1 = iVar6;
    }
    owner = (t_object *)pd_new(env_tilde_class);
    owner[1].te_binbuf = p_Var2;
    *(uint *)((long)&owner[1].te_inlet + 4) = uVar7;
    *(undefined4 *)&owner[1].te_outlet = 0;
    *(int *)((long)&owner[1].te_outlet + 4) = iVar1;
    for (lVar3 = 0x17; lVar3 != 0x37; lVar3 = lVar3 + 1) {
      *(undefined4 *)((long)&(owner->te_g).g_pd + lVar3 * 4) = 0;
    }
    uVar9 = 0;
    uVar8 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar8 = uVar9;
    }
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      dVar10 = cos(((double)(int)uVar9 * 6.28318) / (double)(int)uVar7);
      (&p_Var2->b_n)[uVar9] = (int)(float)((1.0 - dVar10) / (double)(int)uVar7);
    }
    for (; (long)uVar8 < (long)(int)uVar7 + 0x40; uVar8 = uVar8 + 1) {
      (&p_Var2->b_n)[uVar8] = 0;
    }
    p_Var4 = clock_new(owner,env_tilde_tick);
    owner[1].te_g.g_next = (_gobj *)p_Var4;
    s = gensym("float");
    p_Var5 = (t_pd)outlet_new(owner,s);
    owner[1].te_g.g_pd = p_Var5;
    *(undefined8 *)((long)&owner[4].te_outlet + 4) = 0x4000000000;
  }
  return owner;
}

Assistant:

static void *env_tilde_new(t_floatarg fnpoints, t_floatarg fperiod)
{
    int npoints = fnpoints;
    int period = fperiod;
    t_sigenv *x;
    t_sample *buf;
    int i;

    if (npoints < 1) npoints = 1024;
    if (period < 1) period = npoints/2;
    if (period < npoints / MAXOVERLAP + 1)
        period = npoints / MAXOVERLAP + 1;
    if (!(buf = getbytes(sizeof(t_sample) * (npoints + INITVSTAKEN))))
    {
        pd_error(0, "env: couldn't allocate buffer");
        return (0);
    }
    x = (t_sigenv *)pd_new(env_tilde_class);
    x->x_buf = buf;
    x->x_npoints = npoints;
    x->x_phase = 0;
    x->x_period = period;
    for (i = 0; i < MAXOVERLAP; i++) x->x_sumbuf[i] = 0;
    for (i = 0; i < npoints; i++)
        buf[i] = (1. - cos((2 * 3.14159 * i) / npoints))/npoints;
    for (; i < npoints+INITVSTAKEN; i++) buf[i] = 0;
    x->x_clock = clock_new(x, (t_method)env_tilde_tick);
    x->x_outlet = outlet_new(&x->x_obj, gensym("float"));
    x->x_f = 0;
    x->x_allocforvs = INITVSTAKEN;
    return (x);
}